

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchncnn.cpp
# Opt level: O0

void benchmark(char *comment,Mat *_in,Option *opt)

{
  char *pcVar1;
  double *pdVar2;
  undefined4 *in_RDX;
  Mat *in_RSI;
  undefined8 in_RDI;
  double time;
  double end;
  Extractor ex_1;
  double start;
  int i_1;
  double time_avg;
  double time_max;
  double time_min;
  Extractor ex;
  int i;
  Mat out;
  DataReaderFromEmpty dr;
  char parampath [256];
  Net net;
  Mat in;
  Net *in_stack_fffffffffffffce0;
  Net *in_stack_fffffffffffffce8;
  Mat *in_stack_fffffffffffffcf0;
  char *blob_name;
  Net *in_stack_fffffffffffffcf8;
  Extractor *this;
  PoolAllocator *this_00;
  double local_2f0;
  Net *local_2e8;
  DataReader *in_stack_fffffffffffffd30;
  Net *in_stack_fffffffffffffd38;
  int local_28c;
  double local_288;
  double local_280;
  double local_278 [10];
  int local_224;
  Mat local_220;
  undefined1 local_1e0 [264];
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined2 local_b8;
  Mat local_58;
  undefined4 *local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  ncnn::Mat::Mat(&local_58,in_RSI);
  ncnn::Mat::fill(in_stack_fffffffffffffcf0,(float)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  ncnn::Net::Net(in_stack_fffffffffffffce0);
  local_b8 = *(undefined2 *)(local_18 + 8);
  local_d8 = *local_18;
  uStack_d4 = local_18[1];
  uStack_d0 = local_18[2];
  uStack_cc = local_18[3];
  local_c8 = local_18[4];
  uStack_c4 = local_18[5];
  uStack_c0 = local_18[6];
  uStack_bc = local_18[7];
  this_00 = (PoolAllocator *)(local_1e0 + 8);
  sprintf((char *)this_00,"%s.param",local_8);
  ncnn::Net::load_param(in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
  this = (Extractor *)local_1e0;
  DataReaderFromEmpty::DataReaderFromEmpty((DataReaderFromEmpty *)in_stack_fffffffffffffce0);
  ncnn::Net::load_model(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  ncnn::UnlockedPoolAllocator::clear((UnlockedPoolAllocator *)this_00);
  ncnn::PoolAllocator::clear(this_00);
  sleep(10);
  ncnn::Mat::Mat(&local_220);
  for (local_224 = 0; local_224 < g_warmup_loop_count; local_224 = local_224 + 1) {
    ncnn::Net::create_extractor(in_stack_fffffffffffffce8);
    ncnn::Extractor::input(this,(char *)in_stack_fffffffffffffcf0,(Mat *)in_stack_fffffffffffffce8);
    ncnn::Extractor::extract
              (this,(char *)in_stack_fffffffffffffcf0,(Mat *)in_stack_fffffffffffffce8);
    ncnn::Extractor::~Extractor((Extractor *)0x1127f9);
  }
  local_278[0] = 1.79769313486232e+308;
  local_280 = -1.79769313486232e+308;
  local_288 = 0.0;
  for (local_28c = 0; local_28c < g_loop_count; local_28c = local_28c + 1) {
    pcVar1 = (char *)ncnn::get_current_time();
    blob_name = pcVar1;
    ncnn::Net::create_extractor(in_stack_fffffffffffffce8);
    ncnn::Extractor::input(this,blob_name,(Mat *)in_stack_fffffffffffffce8);
    ncnn::Extractor::extract(this,blob_name,(Mat *)in_stack_fffffffffffffce8);
    ncnn::Extractor::~Extractor((Extractor *)0x112955);
    in_stack_fffffffffffffce8 = (Net *)ncnn::get_current_time();
    local_2f0 = (double)in_stack_fffffffffffffce8 - (double)pcVar1;
    local_2e8 = in_stack_fffffffffffffce8;
    in_stack_fffffffffffffce0 = (Net *)std::min<double>(local_278,&local_2f0);
    local_278[0] = *(double *)&in_stack_fffffffffffffce0->opt;
    pdVar2 = std::max<double>(&local_280,&local_2f0);
    local_280 = *pdVar2;
    local_288 = local_2f0 + local_288;
  }
  fprintf(_stderr,"%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n",SUB84(local_278[0],0),
          SUB84(local_280,0),local_288 / (double)g_loop_count,local_8);
  ncnn::Mat::~Mat((Mat *)0x112a92);
  DataReaderFromEmpty::~DataReaderFromEmpty((DataReaderFromEmpty *)0x112a9f);
  ncnn::Net::~Net(in_stack_fffffffffffffce0);
  ncnn::Mat::~Mat((Mat *)0x112ab9);
  return;
}

Assistant:

void benchmark(const char* comment, const ncnn::Mat& _in, const ncnn::Option& opt)
{
    ncnn::Mat in = _in;
    in.fill(0.01f);

    ncnn::Net net;

    net.opt = opt;

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        net.set_vulkan_device(g_vkdev);
    }
#endif // NCNN_VULKAN

    char parampath[256];
    sprintf(parampath, "%s.param", comment);
    net.load_param(parampath);

    DataReaderFromEmpty dr;
    net.load_model(dr);

    g_blob_pool_allocator.clear();
    g_workspace_pool_allocator.clear();

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        g_blob_vkallocator->clear();
        g_staging_vkallocator->clear();
    }
#endif // NCNN_VULKAN

    // sleep 10 seconds for cooling down SOC  :(
#ifdef _WIN32
    Sleep(10 * 1000);
#else
    sleep(10);
#endif

    ncnn::Mat out;

    // warm up
    for (int i=0; i<g_warmup_loop_count; i++)
    {
        ncnn::Extractor ex = net.create_extractor();
        ex.input("data", in);
        ex.extract("output", out);
    }

    double time_min = DBL_MAX;
    double time_max = -DBL_MAX;
    double time_avg = 0;

    for (int i=0; i<g_loop_count; i++)
    {
        double start = ncnn::get_current_time();

        {
            ncnn::Extractor ex = net.create_extractor();
            ex.input("data", in);
            ex.extract("output", out);
        }

        double end = ncnn::get_current_time();

        double time = end - start;

        time_min = std::min(time_min, time);
        time_max = std::max(time_max, time);
        time_avg += time;
    }

    time_avg /= g_loop_count;

    fprintf(stderr, "%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n", comment, time_min, time_max, time_avg);
}